

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O1

BasicFileStream * __thiscall
Diligent::MakeNewRCObj<Diligent::BasicFileStream,Diligent::IMemoryAllocator>::operator()
          (void *this,char **CtorArgs,EFileAccessMode *CtorArgs_1)

{
  EFileAccessMode EVar1;
  undefined8 *puVar2;
  char *pcVar3;
  RefCountersImpl *pRefCounters;
  BasicFileStream *pObject;
  RefCountersImpl *this_00;
  FileOpenAttribs local_40;
  
  if (*(long **)((long)this + 8) == (long *)0x0) {
    pRefCounters = (RefCountersImpl *)operator_new(0x30);
    (pRefCounters->super_IReferenceCounters)._vptr_IReferenceCounters =
         (_func_int **)&PTR_AddStrongRef_0041f918;
    (pRefCounters->m_ObjectState)._M_i = NotInitialized;
    pRefCounters->m_ObjectWrapperBuffer[0] = 0;
    pRefCounters->m_ObjectWrapperBuffer[1] = 0;
    pRefCounters->m_ObjectWrapperBuffer[2] = 0;
    pRefCounters->m_NumStrongReferences = (__atomic_base<int>)0x0;
    pRefCounters->m_NumWeakReferences = (__atomic_base<int>)0x0;
    (pRefCounters->m_Lock).m_IsLocked._M_base._M_i = false;
    this_00 = pRefCounters;
  }
  else {
    pRefCounters = (RefCountersImpl *)(**(code **)(**(long **)((long)this + 8) + 0x18))();
    this_00 = (RefCountersImpl *)0x0;
  }
  puVar2 = *this;
  if (puVar2 == (undefined8 *)0x0) {
    pObject = (BasicFileStream *)malloc(0x18);
    pcVar3 = *CtorArgs;
    EVar1 = *CtorArgs_1;
    RefCountedObject<Diligent::IFileStream>::RefCountedObject<>
              ((RefCountedObject<Diligent::IFileStream> *)pObject,
               &pRefCounters->super_IReferenceCounters);
    (pObject->super_ObjectBase<Diligent::IFileStream>).super_RefCountedObject<Diligent::IFileStream>
    .super_IFileStream.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00424728;
    (pObject->m_FileWrpr).m_pFile = (CFile *)0x0;
    local_40.strFilePath = pcVar3;
    local_40.AccessMode = EVar1;
    FileWrapper::Open(&pObject->m_FileWrpr,&local_40);
  }
  else {
    pObject = (BasicFileStream *)
              (**(code **)*puVar2)
                        (puVar2,0x18,*(undefined8 *)((long)this + 0x10),
                         *(undefined8 *)((long)this + 0x18),*(undefined4 *)((long)this + 0x20));
    pcVar3 = *CtorArgs;
    EVar1 = *CtorArgs_1;
    RefCountedObject<Diligent::IFileStream>::RefCountedObject<>
              ((RefCountedObject<Diligent::IFileStream> *)pObject,
               &pRefCounters->super_IReferenceCounters);
    (pObject->super_ObjectBase<Diligent::IFileStream>).super_RefCountedObject<Diligent::IFileStream>
    .super_IFileStream.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00424728;
    (pObject->m_FileWrpr).m_pFile = (CFile *)0x0;
    local_40.strFilePath = pcVar3;
    local_40.AccessMode = EVar1;
    FileWrapper::Open(&pObject->m_FileWrpr,&local_40);
  }
  if (this_00 != (RefCountersImpl *)0x0) {
    RefCountersImpl::Attach<Diligent::BasicFileStream,Diligent::IMemoryAllocator>
              (this_00,pObject,*this);
  }
  return pObject;
}

Assistant:

ObjectType* operator()(CtorArgTypes&&... CtorArgs)
    {
        RefCountersImpl*    pNewRefCounters = nullptr;
        IReferenceCounters* pRefCounters    = nullptr;
        if (m_pOwner != nullptr)
            pRefCounters = m_pOwner->GetReferenceCounters();
        else
        {
            // Constructor of RefCountersImpl class is private and only accessible
            // by methods of MakeNewRCObj
            pNewRefCounters = new RefCountersImpl{};
            pRefCounters    = pNewRefCounters;
        }
        ObjectType* pObj = nullptr;
        try
        {
#ifndef DILIGENT_DEVELOPMENT
            static constexpr const char* m_dvpDescription = "<Unavailable in release build>";
            static constexpr const char* m_dvpFileName    = "<Unavailable in release build>";
            static constexpr Int32       m_dvpLineNumber  = -1;
#endif
            // Operators new and delete of RefCountedObject are private and only accessible
            // by methods of MakeNewRCObj
            if (m_pAllocator)
                pObj = new (*m_pAllocator, m_dvpDescription, m_dvpFileName, m_dvpLineNumber) ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            else
                pObj = new ObjectType{pRefCounters, std::forward<CtorArgTypes>(CtorArgs)...};
            if (pNewRefCounters != nullptr)
                pNewRefCounters->Attach<ObjectType, AllocatorType>(pObj, m_pAllocator);
        }
        catch (...)
        {
            if (pNewRefCounters != nullptr)
                pNewRefCounters->SelfDestroy();
            throw;
        }
        return pObj;
    }